

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_st_generator.cc
# Opt level: O0

void __thiscall
t_st_generator::st_setter(t_st_generator *this,ostream *out,string *cls,string *name,string *type)

{
  ostream *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  string *local_30;
  string *type_local;
  string *name_local;
  string *cls_local;
  ostream *out_local;
  t_st_generator *this_local;
  
  local_30 = type;
  type_local = name;
  name_local = cls;
  cls_local = (string *)out;
  out_local = (ostream *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)cls);
  std::operator+(&local_90,name,": ");
  std::operator+(&local_70,&local_90,type);
  st_method(this,out,&local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  poVar1 = std::operator<<((ostream *)cls_local,(string *)name);
  std::operator+(&local_c0," := ",type);
  std::operator<<(poVar1,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  st_close_method(this,(ostream *)cls_local);
  return;
}

Assistant:

void t_st_generator::st_setter(std::ostream& out,
                               string cls,
                               string name,
                               string type = "anObject") {
  st_method(out, cls, name + ": " + type);
  out << name << " := " + type;
  st_close_method(out);
}